

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O0

void __thiscall WorkerStream::~WorkerStream(WorkerStream *this)

{
  WorkerFlow *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  it_type it;
  WorkerStream *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
       ::begin(&this->m_flows);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
         ::end(&this->m_flows);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
             ::operator->(&local_18);
    this_00 = ppVar2->second->flow;
    if (this_00 != (WorkerFlow *)0x0) {
      WorkerFlow::~WorkerFlow(this_00);
      operator_delete(this_00,0x38);
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
             ::operator->(&local_18);
    if (ppVar2->second != (WorkerWrapper *)0x0) {
      operator_delete(ppVar2->second,0x10);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
    ::operator++(&local_18,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
  ::~map(&this->m_flows);
  return;
}

Assistant:

WorkerStream::~WorkerStream()
{
    typedef std::map<std::string, WorkerWrapper*>::iterator it_type;

    for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
        delete it->second->flow;
        delete it->second;
    }
}